

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

bool_t strIsAlphanumeric(char *str)

{
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *str;
  if (bVar1 != 0) {
    pbVar2 = (byte *)(str + 1);
    do {
      if (((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
        return 0;
      }
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return 1;
}

Assistant:

bool_t strIsAlphanumeric(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if ((*str < '0' || *str > '9') &&
			(*str < 'A' || *str > 'Z') &&
			(*str < 'a' || *str > 'z'))
			return FALSE;
	return TRUE;
}